

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFNumberTreeObjectHelper::iterator::insertAfter
          (iterator *this,numtree_number key,QPDFObjectHandle *value)

{
  element_type *this_00;
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *value_local;
  numtree_number key_local;
  iterator *this_local;
  
  local_20 = value;
  value_local = (QPDFObjectHandle *)key;
  key_local = (numtree_number)this;
  this_00 = std::__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->impl);
  QPDFObjectHandle::newInteger(&local_30,(longlong)value_local);
  QPDFObjectHandle::QPDFObjectHandle(&local_40,value);
  NNTreeIterator::insertAfter(this_00,&local_30,&local_40);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  updateIValue(this);
  return;
}

Assistant:

void
QPDFNumberTreeObjectHelper::iterator::insertAfter(numtree_number key, QPDFObjectHandle value)
{
    impl->insertAfter(QPDFObjectHandle::newInteger(key), value);
    updateIValue();
}